

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O3

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,ConditionalStatement *stmt)

{
  bool bVar1;
  size_t sVar2;
  Expression *this_00;
  pointer pCVar3;
  pointer pCVar4;
  DataFlowState falseState;
  type trueState;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_2d8;
  DataFlowState local_2b0;
  DataFlowState local_210;
  DataFlowState local_170;
  DataFlowState local_d0;
  
  DataFlowAnalysis::unreachableState((DataFlowAnalysis *)this);
  sVar2 = (stmt->conditions)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    pCVar3 = (stmt->conditions)._M_ptr;
    pCVar4 = pCVar3 + sVar2;
    do {
      this_00 = (pCVar3->expr).ptr;
      bVar1 = this->inCondition;
      this->inCondition = true;
      ast::Expression::
      visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
                (this_00,this_00,(DataFlowAnalysis *)this);
      this->inCondition = bVar1;
      adjustConditionalState((ConstantValue *)&local_2d8,this,this_00);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_2d8);
      if (pCVar3->pattern != (Pattern *)0x0) {
        ast::Pattern::visit<slang::analysis::DataFlowAnalysis>
                  (pCVar3->pattern,(DataFlowAnalysis *)this);
      }
      DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&local_210,&this->stateWhenFalse);
      SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
                (&local_2b0.assigned,(Base *)&this->stateWhenTrue);
      local_2b0.reachable = (this->stateWhenTrue).reachable;
      setState(this,&local_2b0);
      if (local_2b0.assigned.
          super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
          (pointer)local_2b0.assigned.
                   super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                   firstElement) {
        operator_delete(local_2b0.assigned.
                        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                        .data_);
      }
      pCVar3 = pCVar3 + 1;
    } while (pCVar3 != pCVar4);
  }
  ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(stmt->ifTrue,(DataFlowAnalysis *)this);
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
            (&local_170.assigned,(Base *)&this->state);
  local_170.reachable = (this->state).reachable;
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
            (&local_d0.assigned,(Base *)&local_210);
  local_d0.reachable = local_210.reachable;
  setState(this,&local_d0);
  if (local_d0.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)local_d0.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(local_d0.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
  if (stmt->ifFalse != (Statement *)0x0) {
    ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
              (stmt->ifFalse,(DataFlowAnalysis *)this);
  }
  DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&this->state,&local_170);
  if (local_170.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)local_170.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(local_170.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
  if (local_210.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)local_210.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(local_210.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
  return;
}

Assistant:

void visitStmt(const ConditionalStatement& stmt) {
        auto falseState = (DERIVED).unreachableState();
        for (auto& cond : stmt.conditions) {
            visitCondition(*cond.expr);

            if (cond.pattern)
                visit(*cond.pattern);

            (DERIVED).joinState(falseState, stateWhenFalse);
            setState(std::move(stateWhenTrue));
        }

        visit(stmt.ifTrue);

        auto trueState = std::move(state);
        setState(std::move(falseState));
        if (stmt.ifFalse)
            visit(*stmt.ifFalse);

        (DERIVED).joinState(state, trueState);
    }